

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O3

Result __thiscall
wabt::SharedValidator::OnTableInit
          (SharedValidator *this,Location *loc,Var *segment_var,Var *table_var)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  Result RVar4;
  ElemType elem_type;
  TableType table_type;
  ElemType local_ec;
  Location *local_e8;
  TableType local_e0;
  Var local_c0;
  Var local_78;
  
  this->expr_loc_ = loc;
  local_e0.element.enum_ = Any;
  local_e0.limits.initial = 0;
  local_e0.limits.max._0_7_ = 0;
  local_e0.limits._15_4_ = 0;
  local_e8 = loc;
  Var::Var(&local_78,table_var);
  RVar1 = CheckTableIndex(this,&local_78,&local_e0);
  Var::~Var(&local_78);
  Var::Var(&local_c0,segment_var);
  RVar2 = CheckElemSegmentIndex(this,&local_c0,&local_ec);
  Var::~Var(&local_c0);
  if ((table_var->type_ == Index) && (segment_var->type_ == Index)) {
    RVar3 = TypeChecker::OnTableInit
                      (&this->typechecker_,(table_var->field_2).index_,(segment_var->field_2).index_
                      );
    RVar4 = CheckType(this,local_e8,local_ec.element,local_e0.element,"table.init");
    RVar1.enum_._0_1_ =
         RVar4.enum_ == Error ||
         (RVar3.enum_ == Error || (RVar2.enum_ == Error || RVar1.enum_ == Error));
    RVar1.enum_._1_3_ = 0;
    return (Result)RVar1.enum_;
  }
  __assert_fail("is_index()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/ir.h",
                0x38,"Index wabt::Var::index() const");
}

Assistant:

Result SharedValidator::OnTableInit(const Location& loc,
                                    Var segment_var,
                                    Var table_var) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  TableType table_type;
  ElemType elem_type;
  result |= CheckTableIndex(table_var, &table_type);
  result |= CheckElemSegmentIndex(segment_var, &elem_type);
  result |= typechecker_.OnTableInit(table_var.index(), segment_var.index());
  result |= CheckType(loc, elem_type.element, table_type.element, "table.init");
  return result;
}